

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# urlapi.c
# Opt level: O0

CURLUcode parse_port(Curl_URL *u,char *hostname)

{
  int iVar1;
  char *pcVar2;
  char local_47 [7];
  long lStack_40;
  char portbuf [7];
  long port;
  char *rest;
  int len;
  char endbracket;
  char *portptr;
  char *hostname_local;
  Curl_URL *u_local;
  
  portptr = hostname;
  hostname_local = (char *)u;
  iVar1 = __isoc99_sscanf(hostname,"[%*45[0123456789abcdefABCDEF:.%%]%c%n",(long)&rest + 7,&rest);
  if ((iVar1 == 1) && (rest._7_1_ == ']')) {
    _len = portptr + (int)rest;
    if (*_len != ':') {
      return CURLUE_MALFORMED_INPUT;
    }
  }
  else {
    _len = strchr(portptr,0x3a);
  }
  if (_len != (char *)0x0) {
    iVar1 = Curl_isdigit((uint)(byte)_len[1]);
    if (iVar1 == 0) {
      return CURLUE_BAD_PORT_NUMBER;
    }
    lStack_40 = strtol(_len + 1,(char **)&port,10);
    if ((lStack_40 < 1) || (0xffff < lStack_40)) {
      return CURLUE_BAD_PORT_NUMBER;
    }
    if (*(char *)port != '\0') {
      return CURLUE_BAD_PORT_NUMBER;
    }
    if ((char *)port == _len + 1) {
      *_len = '\0';
    }
    else {
      *_len = '\0';
      *(undefined1 *)port = 0;
      _len = _len + 1;
      curl_msnprintf(local_47,7,"%ld",lStack_40);
      *(long *)(hostname_local + 0x50) = lStack_40;
      pcVar2 = (*Curl_cstrdup)(local_47);
      *(char **)(hostname_local + 0x28) = pcVar2;
      if (*(long *)(hostname_local + 0x28) == 0) {
        return CURLUE_OUT_OF_MEMORY;
      }
    }
  }
  return CURLUE_OK;
}

Assistant:

static CURLUcode parse_port(struct Curl_URL *u, char *hostname)
{
  char *portptr;
  char endbracket;
  int len;

  if((1 == sscanf(hostname, "[%*45[0123456789abcdefABCDEF:.%%]%c%n",
                  &endbracket, &len)) &&
     (']' == endbracket)) {
    /* this is a RFC2732-style specified IP-address */
    portptr = &hostname[len];
    if (*portptr != ':')
      return CURLUE_MALFORMED_INPUT;
  }
  else
    portptr = strchr(hostname, ':');

  if(portptr) {
    char *rest;
    long port;
    char portbuf[7];

    if(!ISDIGIT(portptr[1]))
      return CURLUE_BAD_PORT_NUMBER;

    port = strtol(portptr + 1, &rest, 10);  /* Port number must be decimal */

    if((port <= 0) || (port > 0xffff))
      /* Single unix standard says port numbers are 16 bits long, but we don't
         treat port zero as OK. */
      return CURLUE_BAD_PORT_NUMBER;

    if(rest[0])
      return CURLUE_BAD_PORT_NUMBER;

    if(rest != &portptr[1]) {
      *portptr++ = '\0'; /* cut off the name there */
      *rest = 0;
      /* generate a new to get rid of leading zeroes etc */
      snprintf(portbuf, sizeof(portbuf), "%ld", port);
      u->portnum = port;
      u->port = strdup(portbuf);
      if(!u->port)
        return CURLUE_OUT_OF_MEMORY;
    }
    else {
      /* Browser behavior adaptation. If there's a colon with no digits after,
         just cut off the name there which makes us ignore the colon and just
         use the default port. Firefox and Chrome both do that. */
      *portptr = '\0';
    }
  }

  return CURLUE_OK;
}